

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O2

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::push_back
          (packed_gamma_file3<unsigned_int,_6UL> *this,uint64_t x)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_18;
  uint local_14;
  
  local_14 = (uint)x;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->buffer,&local_14);
  puVar1 = (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (uVar4 % 6 == 0) {
    uVar2 = uVar4 - 6;
    uVar5 = 0;
    while( true ) {
      if (uVar4 <= uVar2) break;
      uVar7 = (ulong)puVar1[uVar2];
      uVar6 = (uint)(byte)(0x40 - (char)LZCOUNT(uVar7));
      if (uVar7 == 0) {
        uVar6 = 1;
      }
      if ((byte)uVar6 < (byte)uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      uVar2 = uVar2 + 1;
    }
    _local_18 = CONCAT44(local_14,uVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->blocks_bitsizes,&local_18);
  }
  lVar3 = 1;
  if (x != 0) {
    lVar3 = 0x40 - LZCOUNT(x);
  }
  this->lower_bound_bitsize = this->lower_bound_bitsize + lVar3;
  return;
}

Assistant:

void push_back(uint64_t x){

		assert(write);

		buffer.push_back(x);

		if(buffer.size()%block_size == 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=buffer.size()-block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		lower_bound_bitsize += wd(x);


	}